

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O1

void get_msurf_descriptor_pecompute_haar(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  ulong uVar20;
  float *pfVar21;
  int iVar22;
  long lVar23;
  int iVar24;
  float *data;
  ulong uVar25;
  long lVar26;
  long lVar27;
  float *pfVar28;
  ulong uVar29;
  float *pfVar30;
  int iVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  float *pfVar35;
  int iVar36;
  float *pfVar37;
  int iVar38;
  float *pfVar39;
  int iVar40;
  float *pfVar41;
  int k_count;
  long lVar42;
  float *pfVar43;
  int iVar44;
  float *pfVar45;
  int k_count_1;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar73;
  undefined1 in_ZMM9 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  int data_width;
  
  auVar53._8_4_ = 0x80000000;
  auVar53._0_8_ = 0x8000000080000000;
  auVar53._12_4_ = 0x80000000;
  auVar54._8_4_ = 0x3effffff;
  auVar54._0_8_ = 0x3effffff3effffff;
  auVar54._12_4_ = 0x3effffff;
  fVar59 = ipoint->scale;
  auVar76 = ZEXT464((uint)fVar59);
  auVar46 = vpternlogd_avx512vl(auVar54,ZEXT416((uint)fVar59),auVar53,0xf8);
  auVar46 = ZEXT416((uint)(fVar59 + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  iVar44 = (int)auVar46._0_4_;
  fVar62 = -0.08 / (fVar59 * fVar59);
  auVar47 = vpternlogd_avx512vl(auVar54,ZEXT416((uint)ipoint->x),auVar53,0xf8);
  auVar47 = ZEXT416((uint)(ipoint->x + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48._0_8_ = (double)auVar47._0_4_;
  auVar48._8_8_ = auVar47._8_8_;
  auVar52._0_8_ = (double)fVar59;
  auVar52._8_8_ = 0;
  auVar47 = vfmadd231sd_fma(auVar48,auVar52,ZEXT816(0x3fe0000000000000));
  auVar51._0_4_ = (float)auVar47._0_8_;
  auVar51._4_12_ = auVar47._4_12_;
  auVar47 = vpternlogd_avx512vl(auVar54,ZEXT416((uint)ipoint->y),auVar53,0xf8);
  auVar47 = ZEXT416((uint)(ipoint->y + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar49._0_8_ = (double)auVar47._0_4_;
  auVar49._8_8_ = auVar47._8_8_;
  auVar47 = vfmadd231sd_fma(auVar49,auVar52,ZEXT816(0x3fe0000000000000));
  auVar50._0_4_ = (float)auVar47._0_8_;
  auVar50._4_12_ = auVar47._4_12_;
  auVar47._0_4_ = (int)auVar46._0_4_;
  auVar47._4_4_ = (int)auVar46._4_4_;
  auVar47._8_4_ = (int)auVar46._8_4_;
  auVar47._12_4_ = (int)auVar46._12_4_;
  auVar46 = vcvtdq2ps_avx(auVar47);
  fVar3 = auVar51._0_4_ - auVar46._0_4_;
  fVar4 = auVar50._0_4_ - auVar46._0_4_;
  auVar46 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar59),auVar51);
  auVar47 = vpternlogd_avx512vl(auVar54,auVar46,auVar53,0xf8);
  auVar46 = ZEXT416((uint)(auVar46._0_4_ + auVar47._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = ZEXT416((uint)fVar59);
  if (iVar44 < (int)auVar46._0_4_) {
    auVar46 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar47,auVar50);
    auVar55._8_4_ = 0x3effffff;
    auVar55._0_8_ = 0x3effffff3effffff;
    auVar55._12_4_ = 0x3effffff;
    auVar56._8_4_ = 0x80000000;
    auVar56._0_8_ = 0x8000000080000000;
    auVar56._12_4_ = 0x80000000;
    auVar48 = vpternlogd_avx512vl(auVar56,auVar46,auVar55,0xea);
    auVar46 = ZEXT416((uint)(auVar46._0_4_ + auVar48._0_4_));
    auVar46 = vroundss_avx(auVar46,auVar46,0xb);
    if (iVar44 < (int)auVar46._0_4_) {
      auVar46 = vfmadd231ss_fma(auVar51,auVar47,ZEXT416(0x41300000));
      auVar57._8_4_ = 0x80000000;
      auVar57._0_8_ = 0x8000000080000000;
      auVar57._12_4_ = 0x80000000;
      auVar48 = vpternlogd_avx512vl(auVar57,auVar46,auVar55,0xea);
      auVar46 = ZEXT416((uint)(auVar46._0_4_ + auVar48._0_4_));
      auVar46 = vroundss_avx(auVar46,auVar46,0xb);
      if ((int)auVar46._0_4_ + iVar44 <= iimage->width) {
        auVar46 = vfmadd231ss_fma(auVar50,auVar47,ZEXT416(0x41300000));
        auVar67._8_4_ = 0x80000000;
        auVar67._0_8_ = 0x8000000080000000;
        auVar67._12_4_ = 0x80000000;
        auVar48 = vpternlogd_avx512vl(auVar67,auVar46,auVar55,0xea);
        auVar46 = ZEXT416((uint)(auVar46._0_4_ + auVar48._0_4_));
        auVar46 = vroundss_avx(auVar46,auVar46,0xb);
        if ((int)auVar46._0_4_ + iVar44 <= iimage->height) {
          pfVar35 = iimage->data;
          iVar2 = iimage->data_width;
          iVar19 = -0xc;
          lVar23 = 0;
          auVar46._8_4_ = 0x80000000;
          auVar46._0_8_ = 0x8000000080000000;
          auVar46._12_4_ = 0x80000000;
          pfVar21 = haarResponseX;
          pfVar39 = haarResponseY;
          do {
            auVar70._0_4_ = (float)iVar19;
            auVar70._4_12_ = in_ZMM9._4_12_;
            auVar48 = vfmadd213ss_fma(auVar70,auVar47,ZEXT416((uint)fVar4));
            auVar49 = vpternlogd_avx512vl(auVar55,auVar48,auVar46,0xf8);
            auVar48 = ZEXT416((uint)(auVar48._0_4_ + auVar49._0_4_));
            auVar48 = vroundss_avx(auVar48,auVar48,0xb);
            iVar40 = (int)auVar48._0_4_;
            iVar24 = (iVar40 + -1) * iVar2;
            iVar22 = (iVar40 + -1 + iVar44) * iVar2;
            iVar40 = (iVar40 + -1 + iVar44 * 2) * iVar2;
            lVar27 = 0;
            do {
              auVar71._0_4_ = (float)((int)lVar27 + -0xc);
              auVar71._4_12_ = in_ZMM9._4_12_;
              auVar48 = vfmadd213ss_fma(auVar71,auVar47,ZEXT416((uint)fVar3));
              auVar49 = vpternlogd_avx512vl(auVar55,auVar48,auVar46,0xf8);
              auVar48 = ZEXT416((uint)(auVar48._0_4_ + auVar49._0_4_));
              auVar48 = vroundss_avx(auVar48,auVar48,0xb);
              iVar36 = (int)auVar48._0_4_;
              iVar1 = iVar36 + -1 + iVar44;
              iVar31 = iVar36 + -1 + iVar44 * 2;
              fVar59 = pfVar35[iVar22 + -1 + iVar36];
              fVar5 = pfVar35[iVar40 + -1 + iVar36];
              fVar6 = pfVar35[iVar31 + iVar40];
              fVar7 = pfVar35[iVar24 + -1 + iVar36];
              fVar8 = pfVar35[iVar24 + iVar31];
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar24 + iVar1] -
                                                      pfVar35[iVar1 + iVar40])),
                                        SUB6416(ZEXT464(0x40000000),0),
                                        ZEXT416((uint)(fVar6 - fVar7)));
              fVar66 = pfVar35[iVar22 + iVar31];
              pfVar21[lVar27] = (fVar5 - fVar8) + auVar48._0_4_;
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(fVar59 - fVar66)),
                                        SUB6416(ZEXT464(0x40000000),0),
                                        ZEXT416((uint)(fVar6 - fVar7)));
              pfVar39[lVar27] = auVar48._0_4_ - (fVar5 - fVar8);
              lVar27 = lVar27 + 1;
            } while (lVar27 != 0x18);
            iVar19 = iVar19 + 1;
            lVar23 = lVar23 + 1;
            pfVar39 = pfVar39 + 0x18;
            pfVar21 = pfVar21 + 0x18;
          } while (lVar23 != 0x18);
          goto LAB_0018a3d4;
        }
      }
    }
  }
  iVar2 = iVar44 * 2;
  iVar19 = -0xc;
  lVar27 = 0;
  lVar23 = 0;
  do {
    auVar60._0_4_ = (float)iVar19;
    auVar60._4_12_ = in_ZMM9._4_12_;
    auVar46 = vfmadd213ss_fma(auVar60,auVar76._0_16_,ZEXT416((uint)fVar4));
    auVar63._8_4_ = 0x3effffff;
    auVar63._0_8_ = 0x3effffff3effffff;
    auVar63._12_4_ = 0x3effffff;
    auVar16._8_4_ = 0x80000000;
    auVar16._0_8_ = 0x8000000080000000;
    auVar16._12_4_ = 0x80000000;
    auVar48 = vpternlogd_avx512vl(auVar63,auVar46,auVar16,0xf8);
    auVar46 = ZEXT416((uint)(auVar46._0_4_ + auVar48._0_4_));
    auVar46 = vroundss_avx(auVar46,auVar46,0xb);
    iVar40 = (int)auVar46._0_4_;
    lVar42 = 0;
    lVar26 = lVar27;
    do {
      pfVar35 = (float *)((long)haarResponseY + lVar26);
      auVar61._0_4_ = (float)((int)lVar42 + -0xc);
      auVar61._4_12_ = in_ZMM9._4_12_;
      auVar46 = vfmadd213ss_fma(auVar61,auVar76._0_16_,ZEXT416((uint)fVar3));
      auVar64._8_4_ = 0x3effffff;
      auVar64._0_8_ = 0x3effffff3effffff;
      auVar64._12_4_ = 0x3effffff;
      auVar17._8_4_ = 0x80000000;
      auVar17._0_8_ = 0x8000000080000000;
      auVar17._12_4_ = 0x80000000;
      auVar48 = vpternlogd_avx512vl(auVar64,auVar46,auVar17,0xf8);
      auVar46 = ZEXT416((uint)(auVar46._0_4_ + auVar48._0_4_));
      auVar46 = vroundss_avx(auVar46,auVar46,0xb);
      iVar24 = (int)auVar46._0_4_;
      if ((((iVar40 < 1) || (iVar24 < 1)) || (iimage->height < iVar2 + iVar40)) ||
         (iVar22 = iVar2 + iVar24, iimage->width < iVar22)) {
        haarXY(iimage,iVar40,iVar24,iVar44,(float *)((long)haarResponseX + lVar26),pfVar35);
        auVar76 = ZEXT1664(auVar47);
      }
      else {
        iVar1 = iVar24 + -1 + iVar44;
        pfVar21 = iimage->data;
        iVar31 = iimage->data_width;
        iVar36 = iVar31 * (iVar40 + -1);
        iVar38 = iVar31 * (iVar40 + -1 + iVar44);
        fVar59 = pfVar21[iVar38 + -1 + iVar24];
        iVar31 = iVar31 * (iVar2 + -1 + iVar40);
        fVar5 = pfVar21[iVar31 + -1 + iVar24];
        fVar6 = pfVar21[iVar31 + -1 + iVar22];
        fVar7 = pfVar21[iVar36 + -1 + iVar24];
        fVar8 = pfVar21[iVar36 + -1 + iVar22];
        fVar66 = pfVar21[iVar38 + -1 + iVar22];
        auVar46 = vfmadd213ss_fma(ZEXT416((uint)(pfVar21[iVar36 + iVar1] - pfVar21[iVar31 + iVar1]))
                                  ,SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)(fVar6 - fVar7)));
        *(float *)((long)haarResponseX + lVar26) = (fVar5 - fVar8) + auVar46._0_4_;
        auVar46 = vfmadd213ss_fma(ZEXT416((uint)(fVar59 - fVar66)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar6 - fVar7)));
        *pfVar35 = auVar46._0_4_ - (fVar5 - fVar8);
      }
      lVar42 = lVar42 + 1;
      lVar26 = lVar26 + 4;
    } while (lVar42 != 0x18);
    iVar19 = iVar19 + 1;
    lVar23 = lVar23 + 1;
    lVar27 = lVar27 + 0x60;
  } while (lVar23 != 0x18);
LAB_0018a3d4:
  fVar59 = auVar76._0_4_;
  auVar75._8_4_ = 0x3effffff;
  auVar75._0_8_ = 0x3effffff3effffff;
  auVar75._12_4_ = 0x3effffff;
  auVar74._8_4_ = 0x80000000;
  auVar74._0_8_ = 0x8000000080000000;
  auVar74._12_4_ = 0x80000000;
  auVar46 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)(fVar59 * 0.5)),auVar74,0xf8);
  auVar46 = ZEXT416((uint)(fVar59 * 0.5 + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)(fVar59 * 1.5)),auVar74,0xf8);
  auVar47 = ZEXT416((uint)(fVar59 * 1.5 + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)(fVar59 * 2.5)),auVar74,0xf8);
  auVar48 = ZEXT416((uint)(fVar59 * 2.5 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)(fVar59 * 3.5)),auVar74,0xf8);
  auVar49 = ZEXT416((uint)(fVar59 * 3.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)(fVar59 * 4.5)),auVar74,0xf8);
  auVar50 = ZEXT416((uint)(fVar59 * 4.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)(fVar59 * 5.5)),auVar74,0xf8);
  auVar51 = ZEXT416((uint)(fVar59 * 5.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)(fVar59 * 6.5)),auVar74,0xf8);
  auVar52 = ZEXT416((uint)(fVar59 * 6.5 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)(fVar59 * 7.5)),auVar74,0xf8);
  auVar53 = ZEXT416((uint)(auVar53._0_4_ + fVar59 * 7.5));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)(fVar59 * 8.5)),auVar74,0xf8);
  auVar54 = ZEXT416((uint)(fVar59 * 8.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)(fVar59 * 9.5)),auVar74,0xf8);
  auVar55 = ZEXT416((uint)(fVar59 * 9.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)(fVar59 * 10.5)),auVar74,0xf8);
  auVar56 = ZEXT416((uint)(fVar59 * 10.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)(fVar59 * 11.5)),auVar74,0xf8);
  auVar57 = ZEXT416((uint)(fVar59 * 11.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  fVar66 = auVar48._0_4_;
  fVar59 = fVar66 + auVar47._0_4_;
  fVar3 = fVar66 + auVar46._0_4_;
  fVar4 = fVar66 - auVar46._0_4_;
  fVar5 = fVar66 - auVar47._0_4_;
  fVar6 = fVar66 - auVar49._0_4_;
  fVar7 = fVar66 - auVar50._0_4_;
  fVar8 = fVar66 - auVar51._0_4_;
  fVar66 = fVar66 - auVar52._0_4_;
  fVar73 = auVar53._0_4_;
  fVar9 = fVar73 - auVar49._0_4_;
  fVar10 = fVar73 - auVar50._0_4_;
  fVar11 = fVar73 - auVar51._0_4_;
  fVar12 = fVar73 - auVar52._0_4_;
  fVar13 = fVar73 - auVar54._0_4_;
  fVar14 = fVar73 - auVar55._0_4_;
  fVar15 = fVar73 - auVar56._0_4_;
  fVar73 = fVar73 - auVar57._0_4_;
  gauss_s1_c0[0] = expf(fVar59 * fVar59 * fVar62);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar62);
  gauss_s1_c0[2] = expf(fVar4 * fVar4 * fVar62);
  gauss_s1_c0[3] = expf(fVar5 * fVar5 * fVar62);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar6 * fVar6 * fVar62);
  gauss_s1_c0[6] = expf(fVar7 * fVar7 * fVar62);
  gauss_s1_c0[7] = expf(fVar8 * fVar8 * fVar62);
  gauss_s1_c0[8] = expf(fVar66 * fVar66 * fVar62);
  gauss_s1_c1[0] = expf(fVar9 * fVar9 * fVar62);
  gauss_s1_c1[1] = expf(fVar10 * fVar10 * fVar62);
  gauss_s1_c1[2] = expf(fVar11 * fVar11 * fVar62);
  gauss_s1_c1[3] = expf(fVar12 * fVar12 * fVar62);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar13 * fVar13 * fVar62);
  gauss_s1_c1[6] = expf(fVar14 * fVar14 * fVar62);
  gauss_s1_c1[7] = expf(fVar15 * fVar15 * fVar62);
  gauss_s1_c1[8] = expf(fVar73 * fVar73 * fVar62);
  uVar34 = 0xfffffff8;
  lVar23 = 0;
  fVar59 = 0.0;
  auVar65._8_4_ = 0x7fffffff;
  auVar65._0_8_ = 0x7fffffff7fffffff;
  auVar65._12_4_ = 0x7fffffff;
  lVar27 = 0;
  pfVar35 = haarResponseX;
  pfVar21 = haarResponseY;
  do {
    uVar32 = (uint)uVar34;
    pfVar39 = gauss_s1_c0;
    if (uVar32 == 7) {
      pfVar39 = gauss_s1_c1;
    }
    if (uVar32 == 0xfffffff8) {
      pfVar39 = gauss_s1_c1;
    }
    lVar23 = (long)(int)lVar23;
    iVar44 = (int)lVar27;
    lVar27 = (long)iVar44;
    uVar29 = 0;
    uVar33 = 0xfffffff8;
    pfVar30 = pfVar35;
    pfVar37 = pfVar21;
    do {
      pfVar28 = gauss_s1_c0;
      if (uVar33 == 7) {
        pfVar28 = gauss_s1_c1;
      }
      if (uVar33 == 0xfffffff8) {
        pfVar28 = gauss_s1_c1;
      }
      uVar25 = (ulong)(uVar33 >> 0x1c & 0xfffffff8);
      auVar76 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar20 = uVar29;
      pfVar41 = pfVar37;
      pfVar43 = pfVar30;
      do {
        lVar26 = 0;
        pfVar45 = (float *)((long)pfVar39 + (ulong)(uint)((int)(uVar34 >> 0x1f) << 5));
        do {
          fVar3 = pfVar28[uVar25] * *pfVar45;
          auVar46 = vinsertps_avx(ZEXT416((uint)pfVar41[lVar26]),ZEXT416((uint)pfVar43[lVar26]),0x10
                                 );
          auVar72._0_4_ = fVar3 * auVar46._0_4_;
          auVar72._4_4_ = fVar3 * auVar46._4_4_;
          auVar72._8_4_ = fVar3 * auVar46._8_4_;
          auVar72._12_4_ = fVar3 * auVar46._12_4_;
          auVar46 = vandps_avx(auVar72,auVar65);
          auVar46 = vmovlhps_avx(auVar72,auVar46);
          auVar68._0_4_ = auVar76._0_4_ + auVar46._0_4_;
          auVar68._4_4_ = auVar76._4_4_ + auVar46._4_4_;
          auVar68._8_4_ = auVar76._8_4_ + auVar46._8_4_;
          auVar68._12_4_ = auVar76._12_4_ + auVar46._12_4_;
          auVar76 = ZEXT1664(auVar68);
          pfVar45 = pfVar45 + (ulong)(~uVar32 >> 0x1f) * 2 + -1;
          lVar26 = lVar26 + 1;
        } while (lVar26 != 9);
        uVar20 = uVar20 + 0x18;
        uVar25 = uVar25 + (ulong)(-1 < (int)uVar33) * 2 + -1;
        pfVar43 = pfVar43 + 0x18;
        pfVar41 = pfVar41 + 0x18;
      } while (uVar20 < uVar33 * 0x18 + 0x198);
      fVar3 = gauss_s2_arr[lVar27];
      auVar18._4_4_ = fVar3;
      auVar18._0_4_ = fVar3;
      auVar18._8_4_ = fVar3;
      auVar18._12_4_ = fVar3;
      auVar48 = vmulps_avx512vl(auVar68,auVar18);
      lVar27 = lVar27 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar23) = auVar48;
      auVar69._0_4_ = auVar48._0_4_ * auVar48._0_4_;
      auVar69._4_4_ = auVar48._4_4_ * auVar48._4_4_;
      auVar69._8_4_ = auVar48._8_4_ * auVar48._8_4_;
      auVar69._12_4_ = auVar48._12_4_ * auVar48._12_4_;
      auVar46 = vmovshdup_avx(auVar69);
      auVar47 = vfmadd231ss_fma(auVar46,auVar48,auVar48);
      auVar46 = vshufpd_avx(auVar48,auVar48,1);
      auVar47 = vfmadd213ss_fma(auVar46,auVar46,auVar47);
      auVar46 = vshufps_avx(auVar48,auVar48,0xff);
      auVar46 = vfmadd213ss_fma(auVar46,auVar46,auVar47);
      fVar59 = fVar59 + auVar46._0_4_;
      lVar23 = lVar23 + 4;
      uVar33 = uVar33 + 5;
      uVar29 = uVar29 + 0x78;
      pfVar30 = pfVar30 + 0x78;
      pfVar37 = pfVar37 + 0x78;
    } while (iVar44 + 4 != (int)lVar27);
    pfVar35 = pfVar35 + 5;
    pfVar21 = pfVar21 + 5;
    uVar34 = (ulong)(uVar32 + 5);
  } while ((int)uVar32 < 3);
  if (fVar59 < 0.0) {
    fVar59 = sqrtf(fVar59);
  }
  else {
    auVar46 = vsqrtss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
    fVar59 = auVar46._0_4_;
  }
  auVar76 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar59)));
  lVar23 = 0;
  do {
    auVar58 = vmulps_avx512f(auVar76,*(undefined1 (*) [64])(ipoint->descriptor + lVar23));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar23) = auVar58;
    lVar23 = lVar23 + 0x10;
  } while (lVar23 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_pecompute_haar(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_descriptor_gauss_compute_once_array
        - precompute haar wavelet responses and store them in two 24x24 arrays
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);
    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    //r(2.5*s) + r(1.5*s) == -(r(2.5*s) - r(6.5*s))

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    { // some outside

        for (int l=-12, l_count=0; l<12; ++l, ++l_count) {
            // int sample_y = (int) roundf(ipoint_y + l * scale);
            int sample_y_sub_int_scale = (int) roundf(ipoint_y_sub_int_scale + l * scale);

            for (int k=-12, k_count=0; k<12; ++k, k_count++) {

                //Get x coords of sample point
                // int sample_x = (int) roundf(ipoint_x + k * scale);
                int sample_x_sub_int_scale = (int) roundf(ipoint_x_sub_int_scale + k * scale);;

                // float rx = 0.0f;
                // float ry = 0.0f;
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &haarResponseX[l_count*24+k_count], &haarResponseY[l_count*24+k_count]);

                // haarResponseX[(l+12)*24+(k+12)] = rx;
                // haarResponseY[(l+12)*24+(k+12)] = ry;
            }

        }

    } else {

        for (int l=-12, l_count=0; l<12; ++l, ++l_count) {
            // int sample_y = (int) roundf(ipoint_y + l * scale);
            int sample_y_sub_int_scale = (int) roundf(ipoint_y_sub_int_scale + l * scale);

            for (int k=-12, k_count=0; k<12; ++k, ++k_count) {

                //Get x coords of sample point
                // int sample_x = (int) roundf(ipoint_x + k * scale);
                int sample_x_sub_int_scale = (int) roundf(ipoint_x_sub_int_scale + k * scale);;

                // float rx = 0.0f;
                // float ry = 0.0f;
                haarXY_unconditional(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &haarResponseX[l_count*24+k_count], &haarResponseY[l_count*24+k_count]);

                // haarResponseX[(l+12)*24+(k+12)] = rx;
                // haarResponseY[(l+12)*24+(k+12)] = ry;
            }

        }
        
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    /*
    for (int i=-8; i<8; i+=5) {

        for (int j=-8; j<8; j+=5) {

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            //int xs = (int) roundf(ipoint_x + (i+0.5f) * scale);
            //int ys = (int) roundf(ipoint_y + (j+0.5f) * scale);

            int gauss_index_l = -4;
            for (int l = j-4; l < j + 5; ++l, ++gauss_index_l) {

                //Get y coords of sample point
                // int sample_y = (int) roundf(ipoint_y + l * scale);
                //float ys_sub_sample_y = (float) ys-sample_y;
                //float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                //Get y coords of sample point
                // int sample_y_sub_int_scale = sample_y-int_scale;

                float gauss_s1_y = -1;
                if (j == -8 ) {
                    gauss_s1_y = gauss_s1_c1[8-(gauss_index_l+4)];
                } else if (j == -3) {
                    gauss_s1_y = gauss_s1_c0[8-(gauss_index_l+4)];
                } else if (j == 2) {
                    gauss_s1_y = gauss_s1_c0[gauss_index_l+4];
                } else if (j == 7) {
                    gauss_s1_y = gauss_s1_c1[gauss_index_l+4];
                }

                int gauss_index_k = -4;
                for (int k = i-4; k < i + 5; ++k, ++gauss_index_k) {
                
                    //Get x coords of sample point
                    // int sample_x = (int) roundf(ipoint_x + k * scale);

                    //Get x coords of sample point
                    // int sample_x_sub_int_scale = sample_x-int_scale;

                    float gauss_s1_x = -1;
                    if (i == -8 ) {
                        gauss_s1_x = gauss_s1_c1[8-(gauss_index_k+4)];
                    } else if (i == -3) {
                        gauss_s1_x = gauss_s1_c0[8-(gauss_index_k+4)];
                    } else if (i == 2) {
                        gauss_s1_x = gauss_s1_c0[gauss_index_k+4];
                    } else if (i == 7) {
                        gauss_s1_x = gauss_s1_c1[gauss_index_k+4];
                    }

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[(l+12)*24+(k+12)];
                    float ry = haarResponseY[(l+12)*24+(k+12)];
                    // haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }
    */
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}